

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMFData.H
# Opt level: O2

void __thiscall pele::physics::PMF::PmfData::initialize(PmfData *this)

{
  bool bVar1;
  int do_average;
  string datafile;
  ParmParse pp;
  int local_84;
  string local_80;
  ParmParse local_60;
  
  std::__cxx11::string::string((string *)&local_80,"pmf",(allocator *)&local_84);
  amrex::ParmParse::ParmParse(&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  amrex::ParmParse::query(&local_60,"v",&this->m_verbose,0);
  local_84 = 1;
  amrex::ParmParse::query(&local_60,"do_cellAverage",&local_84,0);
  bVar1 = amrex::ParmParse::contains(&local_60,"datafile");
  if (!bVar1) {
    amrex::Abort_host("pmf.datafile is required when using pmf");
  }
  amrex::ParmParse::get(&local_60,"datafile",&local_80,0);
  read_pmf(this,&local_80,local_84,this->m_verbose);
  allocate(this);
  std::__cxx11::string::~string((string *)&local_80);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_60);
  return;
}

Assistant:

void initialize()
  {
    amrex::ParmParse pp("pmf");
    std::string datafile;
    pp.query("v", m_verbose);
    int do_average = 1;
    pp.query("do_cellAverage", do_average);
    if (!pp.contains("datafile")) {
      amrex::Abort("pmf.datafile is required when using pmf");
    }
    pp.get("datafile", datafile);
    read_pmf(datafile, do_average, m_verbose);
    allocate();
  }